

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

string * sensors_analytics::HttpSender::Base64Encode(string *__return_storage_ptr__,string *data)

{
  uchar uVar1;
  undefined4 uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  ulong in_RAX;
  ulong uVar6;
  char cVar7;
  uchar *puVar8;
  size_type sVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  undefined4 uStack_38;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  
  puVar8 = (uchar *)(data->_M_dataplus)._M_p;
  sVar9 = data->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar6 = 0;
  _uStack_38 = in_RAX;
  while( true ) {
    iVar10 = (int)uVar6;
    bVar12 = sVar9 == 0;
    sVar9 = sVar9 - 1;
    cVar7 = (char)__return_storage_ptr__;
    uVar3 = char_array_3[0];
    uVar4 = char_array_3[1];
    uVar2 = uStack_38;
    uVar5 = char_array_3[2];
    if (bVar12) break;
    uVar1 = *puVar8;
    puVar8 = puVar8 + 1;
    char_array_3[uVar6] = uVar1;
    uVar6 = (ulong)(iVar10 + 1U);
    if (iVar10 + 1U == 3) {
      _uStack_38 = CONCAT14(uVar3 >> 2,uVar2);
      _uStack_38 = CONCAT15((uVar3 & 3) << 4 | uVar4 >> 4,_uStack_38);
      _uStack_38 = CONCAT16((uVar4 & 0xf) << 2 | uVar5 >> 6,_uStack_38);
      _uStack_38 = CONCAT17(uVar5,_uStack_38) & 0x3fffffffffffffff;
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        std::__cxx11::string::push_back(cVar7);
      }
      uVar6 = 0;
    }
  }
  if (iVar10 != 0) {
    for (; (int)uVar6 < 3; uVar6 = uVar6 + 1) {
      char_array_3[uVar6] = '\0';
    }
    _uStack_38 = CONCAT14(uVar3 >> 2,uVar2);
    _uStack_38 = CONCAT15((uVar3 & 3) << 4 | uVar4 >> 4,_uStack_38);
    _uStack_38 = CONCAT16((uVar4 & 0xf) << 2 | uVar5 >> 6,_uStack_38);
    _uStack_38 = CONCAT17(uVar5,_uStack_38) & 0x3fffffffffffffff;
    for (lVar11 = 0; lVar11 <= iVar10; lVar11 = lVar11 + 1) {
      std::__cxx11::string::push_back(cVar7);
    }
    iVar10 = iVar10 + -1;
    while (iVar10 = iVar10 + 1, iVar10 < 3) {
      std::__cxx11::string::push_back(cVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpSender::Base64Encode(const string &data) {
  const unsigned char
      *bytes_to_encode = reinterpret_cast<const unsigned char *>(data.data());
  size_t in_len = data.length();
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3];
  unsigned char char_array_4[4];

  while (in_len-- > 0) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++)
        ret += kBase64Chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i != 0) {
    for (j = i; j < 3; j++)
      char_array_3[j] = '\0';
    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;
    for (j = 0; (j < i + 1); j++)
      ret += kBase64Chars[char_array_4[j]];
    while ((i++ < 3))
      ret += '=';
  }
  return ret;
}